

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey
          (ExtPrivkey *this,NetType network_type,Privkey *parent_key,ByteData256 *parent_chain_code,
          uint8_t parent_depth,uint32_t child_num)

{
  ext_key *hdkey;
  bool bVar1;
  CfdException *pCVar2;
  uchar *puVar3;
  size_type sVar4;
  ByteData256 local_3b0;
  ByteData local_398;
  undefined1 local_37a;
  allocator local_379;
  string local_378;
  CfdSourceLocation local_358;
  allocator<unsigned_char> local_339;
  undefined1 local_338 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_318;
  CfdSourceLocation local_2f8;
  int local_2dc;
  undefined1 auStack_2d8 [4];
  int ret;
  ext_key extkey;
  undefined1 local_200 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  undefined1 local_1d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  undefined1 local_1a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  undefined1 local_170 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_bytes;
  Pubkey pubkey;
  ext_key parent;
  CfdSourceLocation local_58;
  uint32_t local_30;
  uint8_t local_29;
  uint32_t child_num_local;
  uint8_t parent_depth_local;
  ByteData256 *parent_chain_code_local;
  Privkey *parent_key_local;
  ExtPrivkey *pEStack_10;
  NetType network_type_local;
  ExtPrivkey *this_local;
  
  local_30 = child_num;
  local_29 = parent_depth;
  _child_num_local = parent_chain_code;
  parent_chain_code_local = (ByteData256 *)parent_key;
  parent_key_local._4_4_ = network_type;
  pEStack_10 = this;
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Privkey::Privkey(&this->privkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  bVar1 = Privkey::IsValid((Privkey *)parent_chain_code_local);
  if (!bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x1e8;
    local_58.funcname = "ExtPrivkey";
    logger::warn<>(&local_58,"invalid privkey.");
    parent.pub_key_tweak_sum[0x1a] = '\x01';
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(parent.pub_key_tweak_sum + 0x1c),
               "Failed to privkey. ExtPrivkey invalid privkey.",
               (allocator *)(parent.pub_key_tweak_sum + 0x1b));
    CfdException::CfdException
              (pCVar2,kCfdIllegalArgumentError,(string *)(parent.pub_key_tweak_sum + 0x1c));
    parent.pub_key_tweak_sum[0x1a] = '\0';
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  memset((void *)((long)&pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),0,0xc0);
  memset((void *)((long)&pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),0,0xc0);
  parent.hash160[0xc] = 0x94;
  parent.hash160[0xd] = 0x83;
  parent.hash160[0xe] = '5';
  parent.hash160[0xf] = '\x04';
  if ((parent_key_local._4_4_ == kMainnet) || (parent_key_local._4_4_ == kLiquidV1)) {
    builtin_memcpy(parent.hash160 + 0xc,"䭈\x04",4);
  }
  parent.parent160[0xc] = local_29;
  Privkey::GeneratePubkey
            ((Pubkey *)
             &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)parent_chain_code_local,
             true);
  Privkey::GetData((ByteData *)
                   &pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Privkey *)parent_chain_code_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,
                     (ByteData *)
                     &pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &pubkey_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Pubkey::GetData((ByteData *)
                  &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (Pubkey *)
                  &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,
                     (ByteData *)
                     &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  HashUtil::Hash160((ByteData160 *)
                    &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (Pubkey *)
                    &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData160::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0,
             (ByteData160 *)
             &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData160::~ByteData160
            ((ByteData160 *)
             &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData256::GetData((ByteData *)(extkey.pub_key_tweak_sum + 0x18),_child_num_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,
                     (ByteData *)(extkey.pub_key_tweak_sum + 0x18));
  ByteData::~ByteData((ByteData *)(extkey.pub_key_tweak_sum + 0x18));
  parent.pad1[2] = '\0';
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  memcpy(parent.pad1 + 3,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  memcpy(parent.hash160 + 0x13,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  memcpy(parent.priv_key + 0x1d,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
  hdkey = (ext_key *)
          ((long)&pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 4);
  memcpy(hdkey,puVar3,sVar4);
  extkey.pub_key_tweak_sum[8] = '\0';
  extkey.pub_key_tweak_sum[9] = '\0';
  extkey.pub_key_tweak_sum[10] = '\0';
  extkey.pub_key_tweak_sum[0xb] = '\0';
  extkey.pub_key_tweak_sum[0xc] = '\0';
  extkey.pub_key_tweak_sum[0xd] = '\0';
  extkey.pub_key_tweak_sum[0xe] = '\0';
  extkey.pub_key_tweak_sum[0xf] = '\0';
  extkey.pub_key_tweak_sum[0x10] = '\0';
  extkey.pub_key_tweak_sum[0x11] = '\0';
  extkey.pub_key_tweak_sum[0x12] = '\0';
  extkey.pub_key_tweak_sum[0x13] = '\0';
  extkey.pub_key_tweak_sum[0x14] = '\0';
  extkey.pub_key_tweak_sum[0x15] = '\0';
  extkey.pub_key_tweak_sum[0x16] = '\0';
  extkey.pub_key_tweak_sum[0x17] = '\0';
  extkey.pub_key[0x19] = '\0';
  extkey.pub_key[0x1a] = '\0';
  extkey.pub_key[0x1b] = '\0';
  extkey.pub_key[0x1c] = '\0';
  extkey.pub_key[0x1d] = '\0';
  extkey.pub_key[0x1e] = '\0';
  extkey.pub_key[0x1f] = '\0';
  extkey.pub_key[0x20] = '\0';
  extkey.pub_key_tweak_sum[0] = '\0';
  extkey.pub_key_tweak_sum[1] = '\0';
  extkey.pub_key_tweak_sum[2] = '\0';
  extkey.pub_key_tweak_sum[3] = '\0';
  extkey.pub_key_tweak_sum[4] = '\0';
  extkey.pub_key_tweak_sum[5] = '\0';
  extkey.pub_key_tweak_sum[6] = '\0';
  extkey.pub_key_tweak_sum[7] = '\0';
  extkey.pub_key[9] = '\0';
  extkey.pub_key[10] = '\0';
  extkey.pub_key[0xb] = '\0';
  extkey.pub_key[0xc] = '\0';
  extkey.pub_key[0xd] = '\0';
  extkey.pub_key[0xe] = '\0';
  extkey.pub_key[0xf] = '\0';
  extkey.pub_key[0x10] = '\0';
  extkey.pub_key[0x11] = '\0';
  extkey.pub_key[0x12] = '\0';
  extkey.pub_key[0x13] = '\0';
  extkey.pub_key[0x14] = '\0';
  extkey.pub_key[0x15] = '\0';
  extkey.pub_key[0x16] = '\0';
  extkey.pub_key[0x17] = '\0';
  extkey.pub_key[0x18] = '\0';
  extkey.version = 0;
  extkey.pad2[0] = '\0';
  extkey.pad2[1] = '\0';
  extkey.pad2[2] = '\0';
  extkey.pub_key[0] = '\0';
  extkey.pub_key[1] = '\0';
  extkey.pub_key[2] = '\0';
  extkey.pub_key[3] = '\0';
  extkey.pub_key[4] = '\0';
  extkey.pub_key[5] = '\0';
  extkey.pub_key[6] = '\0';
  extkey.pub_key[7] = '\0';
  extkey.pub_key[8] = '\0';
  extkey.hash160[4] = '\0';
  extkey.hash160[5] = '\0';
  extkey.hash160[6] = '\0';
  extkey.hash160[7] = '\0';
  extkey.hash160[8] = '\0';
  extkey.hash160[9] = '\0';
  extkey.hash160[10] = '\0';
  extkey.hash160[0xb] = '\0';
  extkey.hash160[0xc] = '\0';
  extkey.hash160[0xd] = '\0';
  extkey.hash160[0xe] = '\0';
  extkey.hash160[0xf] = '\0';
  extkey.hash160[0x10] = '\0';
  extkey.hash160[0x11] = '\0';
  extkey.hash160[0x12] = '\0';
  extkey.hash160[0x13] = '\0';
  extkey.priv_key[0x19] = '\0';
  extkey.priv_key[0x1a] = '\0';
  extkey.priv_key[0x1b] = '\0';
  extkey.priv_key[0x1c] = '\0';
  extkey.priv_key[0x1d] = '\0';
  extkey.priv_key[0x1e] = '\0';
  extkey.priv_key[0x1f] = '\0';
  extkey.priv_key[0x20] = '\0';
  extkey.child_num = 0;
  extkey.hash160[0] = '\0';
  extkey.hash160[1] = '\0';
  extkey.hash160[2] = '\0';
  extkey.hash160[3] = '\0';
  extkey.priv_key[9] = '\0';
  extkey.priv_key[10] = '\0';
  extkey.priv_key[0xb] = '\0';
  extkey.priv_key[0xc] = '\0';
  extkey.priv_key[0xd] = '\0';
  extkey.priv_key[0xe] = '\0';
  extkey.priv_key[0xf] = '\0';
  extkey.priv_key[0x10] = '\0';
  extkey.priv_key[0x11] = '\0';
  extkey.priv_key[0x12] = '\0';
  extkey.priv_key[0x13] = '\0';
  extkey.priv_key[0x14] = '\0';
  extkey.priv_key[0x15] = '\0';
  extkey.priv_key[0x16] = '\0';
  extkey.priv_key[0x17] = '\0';
  extkey.priv_key[0x18] = '\0';
  extkey.pad1[3] = '\0';
  extkey.pad1[4] = '\0';
  extkey.pad1[5] = '\0';
  extkey.pad1[6] = '\0';
  extkey.pad1[7] = '\0';
  extkey.pad1[8] = '\0';
  extkey.pad1[9] = '\0';
  extkey.priv_key[0] = '\0';
  extkey.priv_key[1] = '\0';
  extkey.priv_key[2] = '\0';
  extkey.priv_key[3] = '\0';
  extkey.priv_key[4] = '\0';
  extkey.priv_key[5] = '\0';
  extkey.priv_key[6] = '\0';
  extkey.priv_key[7] = '\0';
  extkey.priv_key[8] = '\0';
  extkey.parent160[8] = '\0';
  extkey.parent160[9] = '\0';
  extkey.parent160[10] = '\0';
  extkey.parent160[0xb] = '\0';
  extkey.parent160[0xc] = '\0';
  extkey.parent160[0xd] = '\0';
  extkey.parent160[0xe] = '\0';
  extkey.parent160[0xf] = '\0';
  extkey.parent160[0x10] = '\0';
  extkey.parent160[0x11] = '\0';
  extkey.parent160[0x12] = '\0';
  extkey.parent160[0x13] = '\0';
  extkey.depth = '\0';
  extkey.pad1[0] = '\0';
  extkey.pad1[1] = '\0';
  extkey.pad1[2] = '\0';
  extkey.chain_code[0x18] = '\0';
  extkey.chain_code[0x19] = '\0';
  extkey.chain_code[0x1a] = '\0';
  extkey.chain_code[0x1b] = '\0';
  extkey.chain_code[0x1c] = '\0';
  extkey.chain_code[0x1d] = '\0';
  extkey.chain_code[0x1e] = '\0';
  extkey.chain_code[0x1f] = '\0';
  extkey.parent160[0] = '\0';
  extkey.parent160[1] = '\0';
  extkey.parent160[2] = '\0';
  extkey.parent160[3] = '\0';
  extkey.parent160[4] = '\0';
  extkey.parent160[5] = '\0';
  extkey.parent160[6] = '\0';
  extkey.parent160[7] = '\0';
  extkey.chain_code[8] = '\0';
  extkey.chain_code[9] = '\0';
  extkey.chain_code[10] = '\0';
  extkey.chain_code[0xb] = '\0';
  extkey.chain_code[0xc] = '\0';
  extkey.chain_code[0xd] = '\0';
  extkey.chain_code[0xe] = '\0';
  extkey.chain_code[0xf] = '\0';
  extkey.chain_code[0x10] = '\0';
  extkey.chain_code[0x11] = '\0';
  extkey.chain_code[0x12] = '\0';
  extkey.chain_code[0x13] = '\0';
  extkey.chain_code[0x14] = '\0';
  extkey.chain_code[0x15] = '\0';
  extkey.chain_code[0x16] = '\0';
  extkey.chain_code[0x17] = '\0';
  auStack_2d8[0] = '\0';
  auStack_2d8[1] = '\0';
  auStack_2d8[2] = '\0';
  auStack_2d8[3] = '\0';
  ret._0_1_ = '\0';
  ret._1_1_ = '\0';
  ret._2_1_ = '\0';
  ret._3_1_ = '\0';
  extkey.chain_code[0] = '\0';
  extkey.chain_code[1] = '\0';
  extkey.chain_code[2] = '\0';
  extkey.chain_code[3] = '\0';
  extkey.chain_code[4] = '\0';
  extkey.chain_code[5] = '\0';
  extkey.chain_code[6] = '\0';
  extkey.chain_code[7] = '\0';
  local_2dc = bip32_key_from_parent(hdkey,local_30,0,(ext_key *)auStack_2d8);
  if (local_2dc != 0) {
    local_2f8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_2f8.filename = local_2f8.filename + 1;
    local_2f8.line = 0x207;
    local_2f8.funcname = "ExtPrivkey";
    logger::warn<int&>(&local_2f8,"bip32_key_from_parent error. ret={}",&local_2dc);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_318,"ExtPubkey generatekey error.",
               (allocator *)
               ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_318);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator(&local_339);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338,0x4e,&local_339);
  ::std::allocator<unsigned_char>::~allocator(&local_339);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338);
  local_2dc = bip32_key_serialize((ext_key *)auStack_2d8,0,puVar3,sVar4);
  if (local_2dc != 0) {
    local_358.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_358.filename = local_358.filename + 1;
    local_358.line = 0x210;
    local_358.funcname = "ExtPrivkey";
    logger::warn<int&>(&local_358,"bip32_key_serialize error. ret={}",&local_2dc);
    local_37a = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_378,"ExtPrivkey serialize error.",&local_379);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_378);
    local_37a = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_398,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338);
  ByteData::operator=(&this->serialize_data_,&local_398);
  ByteData::~ByteData(&local_398);
  ByteData256::ByteData256(&local_3b0);
  ByteData256::operator=(&this->tweak_sum_,&local_3b0);
  ByteData256::~ByteData256(&local_3b0);
  AnalyzeBip32KeyData(auStack_2d8,(string *)0x0,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&this->version_,
                      &this->depth_,&this->child_num_,&this->chaincode_,&this->privkey_,
                      (Pubkey *)0x0,&this->fingerprint_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  Pubkey::~Pubkey((Pubkey *)
                  &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(
    NetType network_type, const Privkey& parent_key,
    const ByteData256& parent_chain_code, uint8_t parent_depth,
    uint32_t child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid privkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to privkey. ExtPrivkey invalid privkey.");
  }

  // create simple parent data
  struct ext_key parent = {};
  memset(&parent, 0, sizeof(parent));
  parent.version = kVersionTestnetPrivkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    parent.version = kVersionMainnetPrivkey;
  }
  parent.depth = parent_depth;
  Pubkey pubkey = parent_key.GeneratePubkey(true);
  std::vector<uint8_t> privkey_bytes = parent_key.GetData().GetBytes();
  std::vector<uint8_t> pubkey_bytes = pubkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(pubkey).GetBytes();
  std::vector<uint8_t> chain_bytes = parent_chain_code.GetData().GetBytes();
  parent.priv_key[0] = BIP32_FLAG_KEY_PRIVATE;
  memcpy(&parent.priv_key[1], privkey_bytes.data(), privkey_bytes.size());
  memcpy(parent.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  memcpy(parent.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(parent.chain_code, chain_bytes.data(), chain_bytes.size());

  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  int ret = bip32_key_from_parent(
      &parent, child_num, BIP32_FLAG_KEY_PRIVATE, &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey generatekey error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PRIVATE, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}